

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

void __thiscall SQClassMember::Null(SQClassMember *this)

{
  SQObjectPtr *in_RDI;
  
  ::SQObjectPtr::Null(in_RDI);
  ::SQObjectPtr::Null(in_RDI);
  return;
}

Assistant:

void Null() {
        val.Null();
        attrs.Null();
    }